

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFNMatrix<45,_Fad<double>_>::TPZFNMatrix
          (TPZFNMatrix<45,_Fad<double>_> *this,int64_t row,int64_t col,Fad<double> *val)

{
  uint uVar1;
  ulong uVar2;
  Fad<double> *buf;
  long lVar3;
  Fad<double> local_48;
  
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018c3930;
  buf = this->fBuf;
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<double>_>,&PTR_PTR_018c3be8,row,col,buf,0x2d);
  (this->super_TPZFMatrix<Fad<double>_>).super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018c3930;
  lVar3 = 0;
  do {
    Fad<double>::Fad(buf);
    lVar3 = lVar3 + -0x20;
    buf = buf + 1;
  } while (lVar3 != -0x5c0);
  local_48.val_ = val->val_;
  uVar1 = (val->dx_).num_elts;
  local_48.dx_.ptr_to_data = (double *)0x0;
  local_48.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 * 8;
    }
    local_48.dx_.ptr_to_data = (double *)operator_new__(uVar2);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_48.dx_.ptr_to_data,(EVP_PKEY_CTX *)(val->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_48.defaultVal = val->defaultVal;
  TPZFMatrix<Fad<double>_>::operator=(&this->super_TPZFMatrix<Fad<double>_>,&local_48);
  Fad<double>::~Fad(&local_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }